

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O3

void Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>::
     run(long rows,long cols,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,
        ResScalar *_res,long resStride,ResScalar alpha,level3_blocking<double,_double> *blocking,
        GemmParallelInfo<long> *info)

{
  ResScalar alpha_00;
  long lVar1;
  RhsScalar *pRVar2;
  LhsScalar *pLVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ResScalar *pRVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  ResScalar local_128;
  long local_120;
  long local_118;
  long local_110;
  double *local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  double *local_d8;
  double *local_d0;
  long local_c8;
  double *local_c0;
  long local_b8;
  ulong local_b0;
  double *local_a8;
  long local_a0;
  double *local_98;
  long local_90;
  blas_data_mapper<double,_long,_0,_0> local_88;
  RhsScalar *local_78;
  LhsScalar *local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  LhsScalar *local_48;
  RhsScalar *local_40;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
  local_35;
  gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
  local_34;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  local_33;
  byte local_32;
  bool local_31;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
  pack_lhs;
  gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
  pack_rhs;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
  gebp;
  
  pRVar6 = &local_128;
  local_128 = alpha;
  local_d8 = _rhs;
  local_100 = lhsStride;
  local_d0 = _lhs;
  lVar9 = blocking->m_mc;
  lVar7 = blocking->m_nc;
  local_b8 = rows;
  if (lVar9 < rows) {
    local_b8 = lVar9;
  }
  local_60 = cols;
  if (lVar7 < cols) {
    local_60 = lVar7;
  }
  local_58 = blocking->m_kc;
  uVar5 = local_b8 * blocking->m_kc;
  if (uVar5 >> 0x3d != 0) {
LAB_00111eef:
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = std::ostream::_M_insert<long>;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_70 = blocking->m_blockA;
  local_68 = cols;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar5 < 0x4001) {
      pLVar3 = (LhsScalar *)((long)&local_128 - (uVar5 * 8 + 0x1e & 0xfffffffffffffff0));
      local_70 = pLVar3;
      pRVar6 = pLVar3;
    }
    else {
      local_90 = rows;
      pLVar3 = (LhsScalar *)malloc(uVar5 * 8);
      if (((ulong)pLVar3 & 0xf) != 0) goto LAB_00111f55;
      local_70 = pLVar3;
      pRVar6 = &local_128;
      rows = local_90;
      if (pLVar3 == (LhsScalar *)0x0) goto LAB_00111eef;
    }
  }
  else {
    pLVar3 = (LhsScalar *)0x0;
    pRVar6 = &local_128;
  }
  uVar8 = local_60 * local_58;
  if (0x1fffffffffffffff < uVar8) {
    pRVar6[-1] = 5.54387602738942e-318;
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = std::ostream::_M_insert<long>;
    pRVar6[-1] = 5.54405389102192e-318;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_78 = blocking->m_blockB;
  local_50 = uVar5;
  local_48 = pLVar3;
  local_b0 = uVar8;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar8 < 0x4001) {
      pRVar6 = (ResScalar *)((long)pRVar6 - (uVar8 * 8 + 0x1e & 0xfffffffffffffff0));
      local_40 = pRVar6;
      local_78 = pRVar6;
    }
    else {
      pRVar6[-1] = 5.53973575727727e-318;
      local_40 = (RhsScalar *)malloc(uVar8 * 8);
      if (((ulong)local_40 & 0xf) != 0) {
LAB_00111f55:
        *(undefined8 *)((long)pRVar6 + -8) = 0x111f74;
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade alignd memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/util/Memory.h"
                      ,0xa1,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      local_78 = local_40;
      if (local_40 == (RhsScalar *)0x0) {
        pRVar6[-1] = 5.54427622056255e-318;
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = std::ostream::_M_insert<long>;
        pRVar6[-1] = (ResScalar)&LAB_00111fa2;
        __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_40 = (RhsScalar *)0x0;
  }
  if (0 < rows) {
    local_c0 = _res;
    local_31 = (local_58 != depth || rows <= lVar9) || lVar7 < local_68;
    local_f0 = local_58 * 8;
    local_120 = rhsStride * local_60 * 8;
    local_e0 = local_b8 * 8;
    local_118 = resStride * local_60 * 8;
    local_f8 = depth;
    local_90 = rows;
    lVar9 = 0;
    do {
      local_e8 = local_b8 + lVar9;
      local_a0 = local_90;
      if (local_e8 < local_90) {
        local_a0 = local_e8;
      }
      if (0 < depth) {
        local_a0 = local_a0 - lVar9;
        local_108 = local_d0 + lVar9;
        local_32 = lVar9 == 0 | local_31;
        local_98 = local_d8;
        lVar9 = 0;
        do {
          pLVar3 = local_70;
          lVar11 = local_a0;
          lVar7 = lVar9 + local_58;
          if (lVar7 < depth) {
            depth = lVar7;
          }
          local_88.m_data = local_108 + lVar9 * local_100;
          local_88.m_stride = local_100;
          local_c8 = depth - lVar9;
          pRVar6[-2] = 0.0;
          pRVar6[-3] = 5.54151933425876e-318;
          gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
          ::operator()(&local_35,pLVar3,(const_blas_data_mapper<double,_long,_0> *)&local_88,
                       depth - lVar9,lVar11,0,(long)pRVar6[-2]);
          local_110 = lVar7;
          if (0 < local_68) {
            local_a8 = local_98;
            lVar7 = 0;
            lVar11 = 0;
            lVar9 = local_60;
            pdVar10 = local_c0;
            do {
              pRVar2 = local_78;
              lVar1 = local_c8;
              lVar12 = lVar9;
              if (local_68 < lVar9) {
                lVar12 = local_68;
              }
              if (local_32 != 0) {
                local_88.m_data = local_a8;
                local_88.m_stride = rhsStride;
                pRVar6[-2] = 0.0;
                pRVar6[-3] = 5.54215173828543e-318;
                gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
                ::operator()(&local_34,pRVar2,(const_blas_data_mapper<double,_long,_0> *)&local_88,
                             lVar1,lVar12 + lVar7,0,(long)pRVar6[-2]);
              }
              local_88.m_data = pdVar10;
              local_88.m_stride = resStride;
              pRVar6[-3] = 0.0;
              pRVar6[-2] = 0.0;
              pRVar6[-4] = -NAN;
              pRVar6[-5] = -NAN;
              pRVar6[-6] = (ResScalar)(lVar12 + lVar7);
              pLVar3 = local_70;
              pRVar2 = local_78;
              lVar12 = local_a0;
              lVar1 = local_c8;
              alpha_00 = local_128;
              pRVar6[-7] = 5.54260627867961e-318;
              gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0>,_4,_4,_false,_false>
              ::operator()(&local_33,&local_88,pLVar3,pRVar2,lVar12,lVar1,(long)pRVar6[-6],alpha_00,
                           (long)pRVar6[-5],(long)pRVar6[-4],(long)pRVar6[-3],(long)pRVar6[-2]);
              lVar11 = lVar11 + local_60;
              lVar9 = lVar9 + local_60;
              lVar7 = lVar7 - local_60;
              local_a8 = (double *)((long)local_a8 + local_120);
              pdVar10 = (double *)((long)pdVar10 + local_118);
            } while (lVar11 < local_68);
          }
          local_98 = (double *)((long)local_98 + local_f0);
          lVar9 = local_110;
          depth = local_f8;
        } while (local_110 < local_f8);
      }
      local_c0 = (double *)((long)local_c0 + local_e0);
      lVar9 = local_e8;
    } while (local_e8 < local_90);
  }
  pRVar2 = local_40;
  if (0x4000 < local_b0) {
    pRVar6[-1] = 5.54340172436941e-318;
    free(pRVar2);
  }
  pLVar3 = local_48;
  if (0x4000 < local_50) {
    pRVar6[-1] = 5.54349559684212e-318;
    free(pLVar3);
  }
  return;
}

Assistant:

static void run(Index rows, Index cols, Index depth,
  const LhsScalar* _lhs, Index lhsStride,
  const RhsScalar* _rhs, Index rhsStride,
  ResScalar* _res, Index resStride,
  ResScalar alpha,
  level3_blocking<LhsScalar,RhsScalar>& blocking,
  GemmParallelInfo<Index>* info = 0)
{
  typedef const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> LhsMapper;
  typedef const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> RhsMapper;
  typedef blas_data_mapper<typename Traits::ResScalar, Index, ColMajor> ResMapper;
  LhsMapper lhs(_lhs,lhsStride);
  RhsMapper rhs(_rhs,rhsStride);
  ResMapper res(_res, resStride);

  Index kc = blocking.kc();                   // cache block size along the K direction
  Index mc = (std::min)(rows,blocking.mc());  // cache block size along the M direction
  Index nc = (std::min)(cols,blocking.nc());  // cache block size along the N direction

  gemm_pack_lhs<LhsScalar, Index, LhsMapper, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
  gemm_pack_rhs<RhsScalar, Index, RhsMapper, Traits::nr, RhsStorageOrder> pack_rhs;
  gebp_kernel<LhsScalar, RhsScalar, Index, ResMapper, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;

#ifdef EIGEN_HAS_OPENMP
  if(info)
  {
    // this is the parallel version!
    int tid = omp_get_thread_num();
    int threads = omp_get_num_threads();

    LhsScalar* blockA = blocking.blockA();
    eigen_internal_assert(blockA!=0);

    std::size_t sizeB = kc*nc;
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, 0);

    // For each horizontal panel of the rhs, and corresponding vertical panel of the lhs...
    for(Index k=0; k<depth; k+=kc)
    {
      const Index actual_kc = (std::min)(k+kc,depth)-k; // => rows of B', and cols of the A'

      // In order to reduce the chance that a thread has to wait for the other,
      // let's start by packing B'.
      pack_rhs(blockB, rhs.getSubMapper(k,0), actual_kc, nc);

      // Pack A_k to A' in a parallel fashion:
      // each thread packs the sub block A_k,i to A'_i where i is the thread id.

      // However, before copying to A'_i, we have to make sure that no other thread is still using it,
      // i.e., we test that info[tid].users equals 0.
      // Then, we set info[tid].users to the number of threads to mark that all other threads are going to use it.
      while(info[tid].users!=0) {}
      info[tid].users += threads;

      pack_lhs(blockA+info[tid].lhs_start*actual_kc, lhs.getSubMapper(info[tid].lhs_start,k), actual_kc, info[tid].lhs_length);

      // Notify the other threads that the part A'_i is ready to go.
      info[tid].sync = k;

      // Computes C_i += A' * B' per A'_i
      for(int shift=0; shift<threads; ++shift)
      {
        int i = (tid+shift)%threads;

        // At this point we have to make sure that A'_i has been updated by the thread i,
        // we use testAndSetOrdered to mimic a volatile access.
        // However, no need to wait for the B' part which has been updated by the current thread!
        if (shift>0) {
          while(info[i].sync!=k) {
          }
        }

        gebp(res.getSubMapper(info[i].lhs_start, 0), blockA+info[i].lhs_start*actual_kc, blockB, info[i].lhs_length, actual_kc, nc, alpha);
      }

      // Then keep going as usual with the remaining B'
      for(Index j=nc; j<cols; j+=nc)
      {
        const Index actual_nc = (std::min)(j+nc,cols)-j;

        // pack B_k,j to B'
        pack_rhs(blockB, rhs.getSubMapper(k,j), actual_kc, actual_nc);

        // C_j += A' * B'
        gebp(res.getSubMapper(0, j), blockA, blockB, rows, actual_kc, actual_nc, alpha);
      }

      // Release all the sub blocks A'_i of A' for the current thread,
      // i.e., we simply decrement the number of users by 1
      for(Index i=0; i<threads; ++i)
        #pragma omp atomic
        info[i].users -= 1;
    }
  }
  else
#endif // EIGEN_HAS_OPENMP
  {
    EIGEN_UNUSED_VARIABLE(info);

    // this is the sequential version!
    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*nc;

    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(RhsScalar, blockB, sizeB, blocking.blockB());

    const bool pack_rhs_once = mc!=rows && kc==depth && nc==cols;

    // For each horizontal panel of the rhs, and corresponding panel of the lhs...
    for(Index i2=0; i2<rows; i2+=mc)
    {
      const Index actual_mc = (std::min)(i2+mc,rows)-i2;

      for(Index k2=0; k2<depth; k2+=kc)
      {
        const Index actual_kc = (std::min)(k2+kc,depth)-k2;

        // OK, here we have selected one horizontal panel of rhs and one vertical panel of lhs.
        // => Pack lhs's panel into a sequential chunk of memory (L2/L3 caching)
        // Note that this panel will be read as many times as the number of blocks in the rhs's
        // horizontal panel which is, in practice, a very low number.
        pack_lhs(blockA, lhs.getSubMapper(i2,k2), actual_kc, actual_mc);

        // For each kc x nc block of the rhs's horizontal panel...
        for(Index j2=0; j2<cols; j2+=nc)
        {
          const Index actual_nc = (std::min)(j2+nc,cols)-j2;

          // We pack the rhs's block into a sequential chunk of memory (L2 caching)
          // Note that this block will be read a very high number of times, which is equal to the number of
          // micro horizontal panel of the large rhs's panel (e.g., rows/12 times).
          if((!pack_rhs_once) || i2==0)
            pack_rhs(blockB, rhs.getSubMapper(k2,j2), actual_kc, actual_nc);

          // Everything is packed, we can now call the panel * block kernel:
          gebp(res.getSubMapper(i2, j2), blockA, blockB, actual_mc, actual_kc, actual_nc, alpha);
        }
      }
    }
  }
}